

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O3

void __thiscall mdsplit::mdsplitter::run_update_links(mdsplitter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  mdsection *pmVar3;
  char *pcVar4;
  ulong uVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  ostream *poVar8;
  size_t sVar9;
  pointer pcVar10;
  byte bVar11;
  long lVar12;
  pointer pmVar13;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  __it;
  size_type sVar14;
  pointer pcVar15;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  __it_00;
  char *pcVar16;
  pointer psVar17;
  pointer __re;
  long lVar18;
  pointer str;
  initializer_list<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
  __l;
  string url;
  path relative_url_1;
  smatch matches;
  path relative_url;
  string header_slug;
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  url_regexes;
  regex second_order_url_or_img_regex;
  regex url_or_img_regex;
  string local_1c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  undefined4 local_194;
  path local_190;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  path *local_148;
  long *local_140;
  size_type local_138;
  long local_130 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  path local_118;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_f0;
  undefined8 local_d0;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  local_88;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_70,"\\[(!?)\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)\\]\\(([^\\)]*)\\)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_118,&local_50);
  local_118._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x2;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_f0,&local_70);
  local_d0 = 4;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_118;
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  ::vector(&local_88,__l,(allocator_type *)&local_190);
  lVar12 = 0x28;
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&local_118._M_pathname._M_dataplus._M_p + lVar12));
    lVar12 = lVar12 + -0x28;
  } while (lVar12 != -0x28);
  local_a8 = local_88.
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __re = local_88.
         super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pmVar13 = (this->sections_).
                super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a0 = (this->sections_).
                 super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      if (pmVar13 != local_a0) {
        do {
          str = (pmVar13->lines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          local_98 = (pmVar13->lines).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (str != local_98) {
            local_148 = &pmVar13->filepath;
            local_194 = 0;
            local_90 = pmVar13;
            do {
              bVar7 = is_codeblock(str);
              bVar11 = (byte)local_194 ^ bVar7;
              local_194 = CONCAT31((int3)((uint)local_194 >> 8),bVar11);
              if ((bVar11 & 1) == 0) {
                local_168.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_168._M_begin._M_current = (char *)0x0;
                local_168.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_168.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1a0._M_current = (str->_M_dataplus)._M_p;
                local_120._M_current = local_1a0._M_current + str->_M_string_length;
                do {
                  bVar7 = std::__detail::
                          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                    (local_1a0,local_120,&local_168,&__re->first,0);
                  if (!bVar7) break;
                  lVar12 = (long)local_168.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_168.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if ((lVar12 == 0) || ((lVar12 >> 3) * -0x5555555555555555 - 3U <= __re->second)) {
                    psVar17 = (pointer)((long)local_168.
                                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar12 + -0x48);
                  }
                  else {
                    psVar17 = local_168.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + __re->second;
                  }
                  pcVar2 = (str->_M_dataplus)._M_p;
                  if (psVar17->matched == true) {
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    std::__cxx11::string::
                    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              ((string *)&local_1c0,
                               (psVar17->
                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).first._M_current,
                               (psVar17->
                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).second._M_current);
                  }
                  else {
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    local_1c0._M_string_length = 0;
                    local_1c0.field_2._M_local_buf[0] = '\0';
                  }
                  bVar7 = is_external(&local_1c0);
                  if (bVar7) {
                    sVar14 = local_1c0._M_string_length;
                    if (this->trace_ == true) {
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&std::cout,local_1c0._M_dataplus._M_p,
                                          local_1c0._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," <- (external)",0xe);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      sVar14 = local_1c0._M_string_length;
                    }
                  }
                  else {
                    lVar12 = std::__cxx11::string::rfind((char)&local_1c0,0x23);
                    if (lVar12 == 0) {
                      std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_1c0);
                      __it_00._M_current =
                           (this->sections_).
                           super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      pmVar3 = (this->sections_).
                               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      lVar12 = (long)pmVar3 - (long)__it_00._M_current;
                      local_118._M_pathname._M_dataplus._M_p = (pointer)&local_c8;
                      if (0 < lVar12 >> 9) {
                        lVar18 = (lVar12 >> 9) + 1;
                        do {
                          bVar7 = __gnu_cxx::__ops::
                                  _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                  operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                              *)&local_118,__it_00);
                          __it._M_current = __it_00._M_current;
                          if (bVar7) goto LAB_00126586;
                          bVar7 = __gnu_cxx::__ops::
                                  _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                  operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                              *)&local_118,__it_00._M_current + 1);
                          __it._M_current = __it_00._M_current + 1;
                          if (bVar7) goto LAB_00126586;
                          bVar7 = __gnu_cxx::__ops::
                                  _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                  operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                              *)&local_118,__it_00._M_current + 2);
                          __it._M_current = __it_00._M_current + 2;
                          if (bVar7) goto LAB_00126586;
                          bVar7 = __gnu_cxx::__ops::
                                  _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                  operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                              *)&local_118,__it_00._M_current + 3);
                          __it._M_current = __it_00._M_current + 3;
                          if (bVar7) goto LAB_00126586;
                          __it_00._M_current = __it_00._M_current + 4;
                          lVar18 = lVar18 + -1;
                          lVar12 = lVar12 + -0x200;
                        } while (1 < lVar18);
                      }
                      lVar12 = lVar12 >> 7;
                      if (lVar12 == 1) {
LAB_0012656d:
                        bVar7 = __gnu_cxx::__ops::
                                _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::operator()
                                          ((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                            *)&local_118,__it_00);
                        __it._M_current = pmVar3;
                        if (bVar7) {
                          __it._M_current = __it_00._M_current;
                        }
                      }
                      else {
                        __it._M_current = __it_00._M_current;
                        if (lVar12 == 2) {
LAB_00126541:
                          bVar7 = __gnu_cxx::__ops::
                                  _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                  operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                              *)&local_118,__it);
                          if (!bVar7) {
                            __it_00._M_current = __it._M_current + 1;
                            goto LAB_0012656d;
                          }
                        }
                        else {
                          __it._M_current = pmVar3;
                          if ((lVar12 == 3) &&
                             (bVar7 = __gnu_cxx::__ops::
                                      _Iter_pred<mdsplit::mdsplitter::run_update_links()::$_0>::
                                      operator()((_Iter_pred<mdsplit::mdsplitter::run_update_links()::__0>
                                                  *)&local_118,__it_00),
                             __it._M_current = __it_00._M_current, !bVar7)) {
                            __it._M_current = __it_00._M_current + 1;
                            goto LAB_00126541;
                          }
                        }
                      }
LAB_00126586:
                      if (__it._M_current ==
                          (this->sections_).
                          super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00126663:
                        sVar14 = local_1c0._M_string_length;
                        if (this->trace_ == true) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Cannot find file for a header ",0x1e);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)&std::cout,local_1c0._M_dataplus._M_p,
                                              local_1c0._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," whose slug is ",0xf);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar8,(char *)local_c8,local_c0);
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) +
                                          (char)poVar8);
                          std::ostream::put((char)poVar8);
                          std::ostream::flush();
                          sVar14 = local_1c0._M_string_length;
                        }
                      }
                      else {
                        bVar7 = mdsection::has_content(__it._M_current,false,false);
                        if (__it._M_current + !bVar7 ==
                            (this->sections_).
                            super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00126663;
                        std::filesystem::current_path_abi_cxx11_();
                        std::filesystem::__cxx11::operator/
                                  (&local_118,&local_190,&__it._M_current[!bVar7].filepath);
                        std::filesystem::__cxx11::path::~path(&local_190);
                        relative_path(&local_190,this,&local_118,local_148);
                        if (this->trace_ == true) {
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)&std::cout,local_1c0._M_dataplus._M_p,
                                              local_1c0._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"->",2);
                          _Var6._M_p = local_190._M_pathname._M_dataplus._M_p;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_190._M_pathname._M_dataplus._M_p ==
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0) {
                            std::ios::clear((int)poVar8 +
                                            (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
                          }
                          else {
                            sVar9 = strlen(local_190._M_pathname._M_dataplus._M_p);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,_Var6._M_p,sVar9);
                          }
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) +
                                          (char)poVar8);
                          std::ostream::put((char)poVar8);
                          std::ostream::flush();
                        }
                        pcVar15 = local_1a0._M_current + -(long)(str->_M_dataplus)._M_p;
                        lVar12 = (long)local_168.
                                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_168.
                                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        if (lVar12 == 0) {
                          pcVar10 = local_168.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-3].
                                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .first._M_current;
LAB_001267b3:
                          pcVar15 = pcVar10 + ((long)pcVar15 - (long)local_168._M_begin._M_current);
                          psVar17 = (pointer)((long)local_168.
                                                                                                        
                                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             lVar12 + -0x48);
                        }
                        else {
                          if ((lVar12 >> 3) * -0x5555555555555555 - 3U <= __re->second) {
                            pcVar10 = pcVar15;
                            pcVar15 = *(pointer *)
                                       ((long)local_168.
                                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar12 + -0x48);
                            goto LAB_001267b3;
                          }
                          psVar17 = local_168.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + __re->second;
                          pcVar15 = pcVar15 + ((long)(psVar17->
                                                                                                          
                                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ).first._M_current -
                                              (long)local_168._M_begin._M_current);
                        }
                        bVar7 = psVar17->matched;
                        pcVar4 = (psVar17->
                                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ).first._M_current;
                        pcVar16 = (psVar17->
                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).second._M_current;
                        local_140 = local_130;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_140,local_190._M_pathname._M_dataplus._M_p,
                                   local_190._M_pathname._M_dataplus._M_p +
                                   local_190._M_pathname._M_string_length);
                        pcVar16 = pcVar16 + -(long)pcVar4;
                        if (bVar7 == false) {
                          pcVar16 = (char *)0x0;
                        }
                        std::__cxx11::string::replace
                                  ((ulong)str,(ulong)pcVar15,pcVar16,(ulong)local_140);
                        if (local_140 != local_130) {
                          operator_delete(local_140,local_130[0] + 1);
                        }
                        local_140 = local_130;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_140,local_190._M_pathname._M_dataplus._M_p,
                                   local_190._M_pathname._M_dataplus._M_p +
                                   local_190._M_pathname._M_string_length);
                        sVar14 = local_138;
                        if (local_140 != local_130) {
                          operator_delete(local_140,local_130[0] + 1);
                        }
                        std::filesystem::__cxx11::path::~path(&local_190);
                        std::filesystem::__cxx11::path::~path(&local_118);
                      }
                      if (local_c8 != local_b8) {
                        operator_delete(local_c8,local_b8[0] + 1);
                      }
                    }
                    else {
                      lVar12 = std::__cxx11::string::rfind((char *)&local_1c0,0x1310a0,0);
                      if (lVar12 == 0) {
                        if (local_1c0._M_string_length == 2) {
                          local_1c0._M_string_length = 0;
                          *local_1c0._M_dataplus._M_p = '\0';
                        }
                        else {
                          std::__cxx11::string::_M_erase((ulong)&local_1c0,0);
                        }
                      }
                      std::filesystem::__cxx11::path::
                      path<std::__cxx11::string,std::filesystem::__cxx11::path>
                                (&local_190,&local_1c0,auto_format);
                      relative_path(&local_118,this,&local_190,local_148);
                      std::filesystem::__cxx11::path::~path(&local_190);
                      if (this->trace_ == true) {
                        pcVar4 = (local_148->_M_pathname)._M_dataplus._M_p;
                        if (pcVar4 == (char *)0x0) {
                          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1422b0);
                        }
                        else {
                          sVar9 = strlen(pcVar4);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,pcVar4,sVar9);
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,": ",2);
                        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&std::cout,local_1c0._M_dataplus._M_p,
                                            local_1c0._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8," -> ",4);
                        _Var6._M_p = local_118._M_pathname._M_dataplus._M_p;
                        if ((long **)local_118._M_pathname._M_dataplus._M_p == (long **)0x0) {
                          std::ios::clear((int)poVar8 +
                                          (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
                        }
                        else {
                          sVar9 = strlen(local_118._M_pathname._M_dataplus._M_p);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,_Var6._M_p,sVar9);
                        }
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) +
                                        (char)poVar8);
                        std::ostream::put((char)poVar8);
                        std::ostream::flush();
                      }
                      pcVar15 = local_1a0._M_current + -(long)(str->_M_dataplus)._M_p;
                      lVar12 = (long)local_168.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (lVar12 == 0) {
                        pcVar10 = local_168.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-3].
                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .first._M_current;
LAB_0012644c:
                        pcVar15 = pcVar10 + ((long)pcVar15 - (long)local_168._M_begin._M_current);
                        psVar17 = (pointer)((long)local_168.
                                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar12 + -0x48);
                      }
                      else {
                        if ((lVar12 >> 3) * -0x5555555555555555 - 3U <= __re->second) {
                          pcVar10 = pcVar15;
                          pcVar15 = *(pointer *)
                                     ((long)local_168.
                                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     lVar12 + -0x48);
                          goto LAB_0012644c;
                        }
                        psVar17 = local_168.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + __re->second;
                        pcVar15 = pcVar15 + ((long)(psVar17->
                                                                                                      
                                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ).first._M_current -
                                            (long)local_168._M_begin._M_current);
                      }
                      bVar7 = psVar17->matched;
                      pcVar4 = (psVar17->
                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ).first._M_current;
                      pcVar16 = (psVar17->
                                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ).second._M_current;
                      local_190._M_pathname._M_dataplus._M_p =
                           (pointer)&local_190._M_pathname.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_190,local_118._M_pathname._M_dataplus._M_p,
                                 local_118._M_pathname._M_dataplus._M_p +
                                 local_118._M_pathname._M_string_length);
                      pcVar16 = pcVar16 + -(long)pcVar4;
                      if (bVar7 == false) {
                        pcVar16 = (char *)0x0;
                      }
                      std::__cxx11::string::replace
                                ((ulong)str,(ulong)pcVar15,pcVar16,
                                 (ulong)local_190._M_pathname._M_dataplus._M_p);
                      paVar1 = &local_190._M_pathname.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
                        operator_delete(local_190._M_pathname._M_dataplus._M_p,
                                        local_190._M_pathname.field_2._M_allocated_capacity + 1);
                      }
                      local_190._M_pathname._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_190,local_118._M_pathname._M_dataplus._M_p,
                                 local_118._M_pathname._M_dataplus._M_p +
                                 local_118._M_pathname._M_string_length);
                      sVar14 = local_190._M_pathname._M_string_length;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
                        operator_delete(local_190._M_pathname._M_dataplus._M_p,
                                        local_190._M_pathname.field_2._M_allocated_capacity + 1);
                      }
                      std::filesystem::__cxx11::path::~path(&local_118);
                    }
                  }
                  uVar5 = __re->second;
                  if (sVar14 == 0) {
                    lVar12 = (long)local_168.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_168.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    if ((lVar12 == 0) || ((lVar12 >> 3) * -0x5555555555555555 - 3U <= uVar5)) {
                      psVar17 = (pointer)((long)local_168.
                                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar12 + -0x48);
                    }
                    else {
                      psVar17 = local_168.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar5;
                    }
                    sVar14 = (long)(psVar17->
                                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).second._M_current -
                             (long)(psVar17->
                                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).first._M_current;
                    if (psVar17->matched == false) {
                      sVar14 = 0;
                    }
                  }
                  else {
                    lVar12 = (long)local_168.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_168.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                  }
                  if ((local_168.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       local_168.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) ||
                     ((lVar12 >> 3) * -0x5555555555555555 - 3U <= uVar5)) {
                    psVar17 = (pointer)((long)&local_168.
                                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               .
                                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-3].
                                               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .first._M_current + lVar12);
                  }
                  else {
                    psVar17 = local_168.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar5;
                  }
                  pcVar15 = local_1a0._M_current +
                            (long)((psVar17->
                                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).first._M_current +
                                  (sVar14 - (long)(local_168._M_begin._M_current + (long)pcVar2)));
                  pcVar2 = (pointer)str->_M_string_length;
                  if (pcVar15 < pcVar2) {
                    pcVar10 = (str->_M_dataplus)._M_p;
                    local_1a0._M_current = pcVar10 + (long)pcVar15;
                    local_120._M_current = pcVar10 + (long)pcVar2;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                             local_1c0.field_2._M_local_buf[0]) + 1);
                  }
                  pmVar13 = local_90;
                } while (pcVar15 < pcVar2);
                if (local_168.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_168.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_168.
                                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_168.
                                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              str = str + 1;
            } while (str != local_98);
          }
          pmVar13 = pmVar13 + 1;
        } while (pmVar13 != local_a0);
      }
      __re = __re + 1;
    } while (__re != local_a8);
  }
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  ::~vector(&local_88);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_70);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return;
}

Assistant:

void mdsplitter::run_update_links() {
        // [some text](URL) -> std::regex{R"([^!]*\[(.*)\]\((.*)\))"};
        // ![some text](URL) -> std::regex{R"(!\[(.*)\]\((.*)\))"};
        std::regex url_or_img_regex{R"(\[([^\[\]]*)\]\(([^\)]*)\))"};

        // [![example_area_1](docs/examples/line_plot/area/area_1.svg)](examples/line_plot/area/area_1.cpp)
        std::regex second_order_url_or_img_regex{
            R"(\[(!?)\[([^\[\]]*)\]\(([^\)]*)\)\]\(([^\)]*)\))"};

        std::vector<std::pair<std::regex, size_t>> url_regexes = {
            {url_or_img_regex, 2}, {second_order_url_or_img_regex, 4}};

        for (const auto &[url_regex, url_idx] : url_regexes) {
            for (auto &section : sections_) {
                bool in_codeblock = false;
                for (auto &line : section.lines) {
                    if (is_codeblock(line)) {
                        in_codeblock = 1 - in_codeblock;
                    }
                    if (in_codeblock) {
                        continue;
                    }
                    std::smatch matches;
                    auto line_begin = line.cbegin();
                    auto line_end = line.cend();
                    size_t replacement_size = 0;
                    while (std::regex_search(line_begin, line_end, matches,
                                             url_regex)) {
                        size_t line_begin_pos = line_begin - line.cbegin();
                        std::string url = matches[url_idx];
                        if (!is_external(url)) {
                            bool is_anchor = url.rfind('#', 0) == 0;
                            if (!is_anchor) {
                                bool is_single_dot_directory =
                                    url.rfind("./", 0) == 0;
                                if (is_single_dot_directory) {
                                    url.erase(url.begin(), url.begin() + 2);
                                }
                                fs::path relative_url =
                                    relative_path(url, section.filepath);
                                if (trace_) {
                                    std::cout << section.filepath.c_str()
                                              << ": " << url << " -> "
                                              << relative_url.c_str()
                                              << std::endl;
                                }
                                size_t pos =
                                    std::distance(line.cbegin(), line_begin) +
                                    matches.position(url_idx);
                                line.replace(pos, matches[url_idx].length(),
                                             relative_url.string());
                                replacement_size = relative_url.string().size();
                            } else {
                                // look for section
                                std::string header_slug = url.substr(1);
                                auto it = std::find_if(
                                    sections_.begin(), sections_.end(),
                                    [&](const mdsection &s) {
                                        return slugify(s.header_name) ==
                                               header_slug;
                                    });

                                // if it's a empty section, point to next
                                // section this is important for empty
                                // categories for which mkdocs creates no links
                                if (it != sections_.end()) {
                                    if (!it->has_content()) {
                                        ++it;
                                    }
                                }

                                // if link to valid section
                                if (it != sections_.end()) {
                                    fs::path absolute_destination =
                                        fs::current_path() / it->filepath;
                                    fs::path relative_url = relative_path(
                                        absolute_destination, section.filepath);
                                    if (trace_) {
                                        std::cout << url << "->"
                                                  << relative_url.c_str()
                                                  << std::endl;
                                    }
                                    size_t pos = std::distance(line.cbegin(),
                                                               line_begin) +
                                                 matches.position(url_idx);
                                    line.replace(pos, matches[url_idx].length(),
                                                 relative_url.string());
                                    replacement_size =
                                        relative_url.string().size();
                                } else {
                                    // not link to a valid section
                                    // we hope we didn't get here
                                    if (trace_) {
                                        std::cout
                                            << "Cannot find file for a header "
                                            << url << " whose slug is "
                                            << header_slug << std::endl;
                                    }
                                    replacement_size = url.size();
                                }
                            }
                        } else {
                            if (trace_) {
                                std::cout << url << " <- (external)"
                                          << std::endl;
                            }
                            replacement_size = url.size();
                        }
                        if (replacement_size == 0) {
                            replacement_size = matches[url_idx].length();
                        }
                        size_t new_begin_pos = line_begin_pos +
                                               matches.position(url_idx) +
                                               replacement_size;
                        if (new_begin_pos < line.size()) {
                            line_begin = line.cbegin() + new_begin_pos;
                            line_end = line.cend();
                        } else {
                            break;
                        }
                    }
                }
            }
        }
    }